

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlRemoveRef(xmlDocPtr doc,xmlAttrPtr attr)

{
  xmlHashTablePtr hash;
  int iVar1;
  xmlListPtr l;
  xmlListPtr local_48;
  xmlRemoveMemo target;
  xmlChar *ID;
  xmlRefTablePtr table;
  xmlListPtr ref_list;
  xmlAttrPtr attr_local;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else if (attr == (xmlAttrPtr)0x0) {
    doc_local._4_4_ = -1;
  }
  else {
    hash = (xmlHashTablePtr)doc->refs;
    if (hash == (xmlHashTablePtr)0x0) {
      doc_local._4_4_ = -1;
    }
    else {
      target.ap = (xmlAttrPtr)xmlNodeListGetString(doc,attr->children,1);
      if (target.ap == (xmlAttrPtr)0x0) {
        doc_local._4_4_ = -1;
      }
      else {
        l = (xmlListPtr)xmlHashLookup(hash,(xmlChar *)target.ap);
        if (l == (xmlListPtr)0x0) {
          (*xmlFree)(target.ap);
          doc_local._4_4_ = -1;
        }
        else {
          local_48 = l;
          target.l = (xmlListPtr)attr;
          xmlListWalk(l,xmlWalkRemoveRef,&local_48);
          iVar1 = xmlListEmpty(l);
          if (iVar1 != 0) {
            xmlHashRemoveEntry(hash,(xmlChar *)target.ap,xmlFreeRefTableEntry);
          }
          (*xmlFree)(target.ap);
          doc_local._4_4_ = 0;
        }
      }
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlRemoveRef(xmlDocPtr doc, xmlAttrPtr attr) {
    xmlListPtr ref_list;
    xmlRefTablePtr table;
    xmlChar *ID;
    xmlRemoveMemo target;

    if (doc == NULL) return(-1);
    if (attr == NULL) return(-1);

    table = (xmlRefTablePtr) doc->refs;
    if (table == NULL)
        return(-1);

    ID = xmlNodeListGetString(doc, attr->children, 1);
    if (ID == NULL)
        return(-1);

    ref_list = xmlHashLookup(table, ID);
    if(ref_list == NULL) {
        xmlFree(ID);
        return (-1);
    }

    /* At this point, ref_list refers to a list of references which
     * have the same key as the supplied attr. Our list of references
     * is ordered by reference address and we don't have that information
     * here to use when removing. We'll have to walk the list and
     * check for a matching attribute, when we find one stop the walk
     * and remove the entry.
     * The list is ordered by reference, so that means we don't have the
     * key. Passing the list and the reference to the walker means we
     * will have enough data to be able to remove the entry.
     */
    target.l = ref_list;
    target.ap = attr;

    /* Remove the supplied attr from our list */
    xmlListWalk(ref_list, xmlWalkRemoveRef, &target);

    /*If the list is empty then remove the list entry in the hash */
    if (xmlListEmpty(ref_list))
        xmlHashRemoveEntry(table, ID, xmlFreeRefTableEntry);
    xmlFree(ID);
    return(0);
}